

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall
cubeb_init_start_stop_destroy_multiple_streams_Test::TestBody
          (cubeb_init_start_stop_destroy_multiple_streams_Test *this)

{
  int iVar1;
  int in_stack_000001f8;
  int in_stack_000001fc;
  
  iVar1 = is_windows_7();
  if (iVar1 == 0) {
    delay_callback = 0;
    test_init_start_stop_destroy_multiple_streams(in_stack_000001fc,in_stack_000001f8);
    test_init_start_stop_destroy_multiple_streams(in_stack_000001fc,in_stack_000001f8);
    test_init_start_stop_destroy_multiple_streams(in_stack_000001fc,in_stack_000001f8);
    test_init_start_stop_destroy_multiple_streams(in_stack_000001fc,in_stack_000001f8);
    delay_callback = 1;
    test_init_start_stop_destroy_multiple_streams(in_stack_000001fc,in_stack_000001f8);
    test_init_start_stop_destroy_multiple_streams(in_stack_000001fc,in_stack_000001f8);
    test_init_start_stop_destroy_multiple_streams(in_stack_000001fc,in_stack_000001f8);
    test_init_start_stop_destroy_multiple_streams(in_stack_000001fc,in_stack_000001f8);
  }
  return;
}

Assistant:

TEST(cubeb, init_start_stop_destroy_multiple_streams)
{
  /* Sometimes, when using WASAPI on windows 7 (vista and 8 are okay), and
   * calling Activate a lot on an AudioClient, 0x800700b7 is returned. This is
   * the HRESULT value for "Cannot create a file when that file already exists",
   * and is not documented as a possible return value for this call. Hence, we
   * try to limit the number of streams we create in this test. */
  if (!is_windows_7()) {
    delay_callback = 0;
    test_init_start_stop_destroy_multiple_streams(0, 0);
    test_init_start_stop_destroy_multiple_streams(1, 0);
    test_init_start_stop_destroy_multiple_streams(0, 150);
    test_init_start_stop_destroy_multiple_streams(1, 150);
    delay_callback = 1;
    test_init_start_stop_destroy_multiple_streams(0, 0);
    test_init_start_stop_destroy_multiple_streams(1, 0);
    test_init_start_stop_destroy_multiple_streams(0, 150);
    test_init_start_stop_destroy_multiple_streams(1, 150);
  }
}